

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void GetEntropyUnrefinedHelper
               (uint32_t val,int i,uint32_t *val_prev,int *i_prev,VP8LBitEntropy *bit_entropy,
               VP8LStreaks *stats)

{
  uint32_t v;
  uint64_t uVar1;
  long lVar2;
  int *in_RCX;
  uint *in_RDX;
  int in_ESI;
  uint in_EDI;
  long *in_R8;
  long in_R9;
  int streak;
  
  v = in_ESI - *in_RCX;
  if (*in_RDX != 0) {
    *(uint *)(in_R8 + 1) = *in_RDX * v + (int)in_R8[1];
    *(uint32_t *)((long)in_R8 + 0xc) = v + *(int *)((long)in_R8 + 0xc);
    *(int *)((long)in_R8 + 0x14) = *in_RCX;
    uVar1 = VP8LFastSLog2(v);
    *in_R8 = uVar1 * (long)(int)v + *in_R8;
    if (*(uint *)(in_R8 + 2) < *in_RDX) {
      *(uint *)(in_R8 + 2) = *in_RDX;
    }
  }
  *(uint *)(in_R9 + (long)(int)(uint)(*in_RDX != 0) * 4) =
       (uint)(3 < (int)v) + *(int *)(in_R9 + (long)(int)(uint)(*in_RDX != 0) * 4);
  lVar2 = in_R9 + 8 + (long)(int)(uint)(*in_RDX != 0) * 8;
  *(uint32_t *)(lVar2 + (long)(int)(uint)(3 < (int)v) * 4) =
       v + *(int *)(lVar2 + (long)(int)(uint)(3 < (int)v) * 4);
  *in_RDX = in_EDI;
  *in_RCX = in_ESI;
  return;
}

Assistant:

static WEBP_INLINE void GetEntropyUnrefinedHelper(
    uint32_t val, int i, uint32_t* WEBP_RESTRICT const val_prev,
    int* WEBP_RESTRICT const i_prev,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  const int streak = i - *i_prev;

  // Gather info for the bit entropy.
  if (*val_prev != 0) {
    bit_entropy->sum += (*val_prev) * streak;
    bit_entropy->nonzeros += streak;
    bit_entropy->nonzero_code = *i_prev;
    bit_entropy->entropy += VP8LFastSLog2(*val_prev) * streak;
    if (bit_entropy->max_val < *val_prev) {
      bit_entropy->max_val = *val_prev;
    }
  }

  // Gather info for the Huffman cost.
  stats->counts[*val_prev != 0] += (streak > 3);
  stats->streaks[*val_prev != 0][(streak > 3)] += streak;

  *val_prev = val;
  *i_prev = i;
}